

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O1

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::costsFirstPartialDerivativeWRTControl
          (OptimalControlProblem *this,double time,VectorDynSize *state,VectorDynSize *control,
          VectorDynSize *partialDerivative)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  Index size;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  string *psVar13;
  ostream *poVar14;
  _Base_ptr p_Var15;
  ulong uVar16;
  ulong uVar17;
  _Rb_tree_header *p_Var18;
  bool bVar19;
  ostringstream errorMsg;
  long *local_1f0;
  long local_1e0 [2];
  VectorDynSize *local_1d0;
  VectorDynSize *local_1c8;
  VectorDynSize *local_1c0;
  _Base_ptr local_1b8;
  undefined8 uStack_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = partialDerivative;
  local_1c0 = state;
  lVar9 = iDynTree::VectorDynSize::size();
  lVar10 = iDynTree::VectorDynSize::size();
  if (lVar9 != lVar10) {
    iDynTree::VectorDynSize::size();
    iDynTree::VectorDynSize::resize((ulong)local_1c8);
  }
  p_Var15 = (this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var18 = &(this->m_pimpl->costs)._M_t._M_impl.super__Rb_tree_header;
  bVar19 = (_Rb_tree_header *)p_Var15 == p_Var18;
  if (!bVar19) {
    bVar6 = true;
    local_1d0 = control;
    do {
      bVar7 = TimeRange::isInRange((TimeRange *)&p_Var15[8]._M_left,time);
      if (bVar7) {
        cVar8 = (**(code **)(**(long **)(p_Var15 + 2) + 0x20))
                          (time,*(long **)(p_Var15 + 2),local_1c0,control,&p_Var15[7]._M_parent);
        if (cVar8 == '\0') {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error while evaluating cost ",0x1c);
          psVar13 = Cost::name_abi_cxx11_(*(Cost **)(p_Var15 + 2));
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar13->_M_dataplus)._M_p,
                               psVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,".",1);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("OptimalControlProblem","costFirstPartialDerivativeWRTControl",
                     (char *)local_1f0);
        }
        else {
          lVar9 = iDynTree::VectorDynSize::size();
          lVar10 = iDynTree::VectorDynSize::size();
          if (lVar9 == lVar10) {
            lVar9 = iDynTree::VectorDynSize::data();
            iDynTree::VectorDynSize::size();
            local_1b8 = p_Var15[8]._M_parent;
            uStack_1b0 = 0;
            uVar11 = iDynTree::VectorDynSize::data();
            uVar12 = iDynTree::VectorDynSize::size();
            if (bVar6) {
              uVar16 = uVar12;
              if (((uVar11 & 7) == 0) &&
                 (uVar16 = (ulong)((uint)(uVar11 >> 3) & 1), (long)uVar12 <= (long)uVar16)) {
                uVar16 = uVar12;
              }
              if (0 < (long)uVar16) {
                uVar17 = 0;
                do {
                  *(double *)(uVar11 + uVar17 * 8) =
                       *(double *)(lVar9 + uVar17 * 8) * (double)local_1b8;
                  uVar17 = uVar17 + 1;
                } while (uVar16 != uVar17);
              }
              lVar10 = uVar12 - uVar16;
              uVar17 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
              if (1 < lVar10) {
                do {
                  pdVar1 = (double *)(lVar9 + uVar16 * 8);
                  dVar4 = pdVar1[1];
                  pdVar2 = (double *)(uVar11 + uVar16 * 8);
                  *pdVar2 = *pdVar1 * (double)local_1b8;
                  pdVar2[1] = dVar4 * (double)local_1b8;
                  uVar16 = uVar16 + 2;
                } while ((long)uVar16 < (long)uVar17);
              }
              if ((long)uVar17 < (long)uVar12) {
                do {
                  *(double *)(uVar11 + uVar17 * 8) =
                       *(double *)(lVar9 + uVar17 * 8) * (double)local_1b8;
                  uVar17 = uVar17 + 1;
                } while (uVar12 != uVar17);
              }
              bVar6 = false;
            }
            else {
              uVar16 = uVar12;
              if (((uVar11 & 7) == 0) &&
                 (uVar16 = (ulong)((uint)(uVar11 >> 3) & 1), (long)uVar12 <= (long)uVar16)) {
                uVar16 = uVar12;
              }
              if (0 < (long)uVar16) {
                uVar17 = 0;
                do {
                  *(double *)(uVar11 + uVar17 * 8) =
                       *(double *)(lVar9 + uVar17 * 8) * (double)local_1b8 +
                       *(double *)(uVar11 + uVar17 * 8);
                  uVar17 = uVar17 + 1;
                } while (uVar16 != uVar17);
              }
              lVar10 = uVar12 - uVar16;
              uVar17 = (lVar10 - (lVar10 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
              if (1 < lVar10) {
                do {
                  pdVar1 = (double *)(lVar9 + uVar16 * 8);
                  dVar5 = pdVar1[1];
                  pdVar2 = (double *)(uVar11 + uVar16 * 8);
                  dVar4 = pdVar2[1];
                  pdVar3 = (double *)(uVar11 + uVar16 * 8);
                  *pdVar3 = *pdVar1 * (double)local_1b8 + *pdVar2;
                  pdVar3[1] = dVar5 * (double)local_1b8 + dVar4;
                  uVar16 = uVar16 + 2;
                } while ((long)uVar16 < (long)uVar17);
              }
              if ((long)uVar17 < (long)uVar12) {
                do {
                  *(double *)(uVar11 + uVar17 * 8) =
                       *(double *)(lVar9 + uVar17 * 8) * (double)local_1b8 +
                       *(double *)(uVar11 + uVar17 * 8);
                  uVar17 = uVar17 + 1;
                } while (uVar12 != uVar17);
              }
            }
            bVar7 = true;
            control = local_1d0;
            goto LAB_001465ba;
          }
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error while evaluating ",0x17);
          psVar13 = Cost::name_abi_cxx11_(*(Cost **)(p_Var15 + 2));
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(psVar13->_M_dataplus)._M_p,
                               psVar13->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,"the jacobian size is expected to match the control dimension.",0x3d);
          std::__cxx11::stringbuf::str();
          iDynTree::reportError
                    ("OptimalControlProblem","costFirstPartialDerivativeWRTControl",
                     (char *)local_1f0);
        }
        if (local_1f0 != local_1e0) {
          operator_delete(local_1f0,local_1e0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar7 = false;
      }
      else {
        bVar7 = true;
      }
LAB_001465ba:
      if (!bVar7) {
        return bVar19;
      }
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
      bVar19 = (_Rb_tree_header *)p_Var15 == p_Var18;
    } while (!bVar19);
  }
  return bVar19;
}

Assistant:

bool OptimalControlProblem::costsFirstPartialDerivativeWRTControl(double time, const VectorDynSize &state, const VectorDynSize &control, VectorDynSize &partialDerivative)
        {
            if (partialDerivative.size() != control.size()) {
                partialDerivative.resize(control.size());
            }

            bool first = true;

            for(auto& cost : m_pimpl->costs){
                if (cost.second.timeRange.isInRange(time)){
                    if (!cost.second.cost->costFirstPartialDerivativeWRTControl(time, state, control, cost.second.controlJacobianBuffer)){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating cost " << cost.second.cost->name() <<".";
                        reportError("OptimalControlProblem", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                        return false;
                    }
                    if (cost.second.controlJacobianBuffer.size() != control.size()){
                        std::ostringstream errorMsg;
                        errorMsg << "Error while evaluating " << cost.second.cost->name() <<": " << "the jacobian size is expected to match the control dimension.";
                        reportError("OptimalControlProblem", "costFirstPartialDerivativeWRTControl", errorMsg.str().c_str());
                        return false;
                    }
                    if (first){
                        toEigen(partialDerivative) = cost.second.weight * toEigen(cost.second.controlJacobianBuffer);
                        first = false;
                    } else {
                        toEigen(partialDerivative) += cost.second.weight * toEigen(cost.second.controlJacobianBuffer);
                    }
                }
            }
            return true;
        }